

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSON __thiscall JSON::makeString(JSON *this,string *utf8)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  JSON JVar1;
  undefined1 local_28 [8];
  unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> local_20;
  undefined1 local_18 [8];
  string *utf8_local;
  
  local_18 = (undefined1  [8])utf8;
  utf8_local = (string *)this;
  std::make_unique<JSON::JSON_string,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  std::unique_ptr<JSON::JSON_value,std::default_delete<JSON::JSON_value>>::
  unique_ptr<JSON::JSON_string,std::default_delete<JSON::JSON_string>,void>
            ((unique_ptr<JSON::JSON_value,std::default_delete<JSON::JSON_value>> *)&local_20,
             (unique_ptr<JSON::JSON_string,_std::default_delete<JSON::JSON_string>_> *)local_28);
  JSON(this,&local_20);
  std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::~unique_ptr(&local_20);
  std::unique_ptr<JSON::JSON_string,_std::default_delete<JSON::JSON_string>_>::~unique_ptr
            ((unique_ptr<JSON::JSON_string,_std::default_delete<JSON::JSON_string>_> *)local_28);
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::makeString(std::string const& utf8)
{
    return {std::make_unique<JSON_string>(utf8)};
}